

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyImplementations.h
# Opt level: O2

void __thiscall iDynTree::DummyEnvironment::~DummyEnvironment(DummyEnvironment *this)

{
  (this->super_IEnvironment)._vptr_IEnvironment = (_func_int **)&PTR__DummyEnvironment_0010c960;
  DummyLight::~DummyLight(&this->m_dummyLight);
  return;
}

Assistant:

virtual std::vector< std::string > getElements() {  return std::vector< std::string >(); }